

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O2

int pt_enc_next(pt_encoder *encoder,pt_packet *packet)

{
  ushort uVar1;
  pt_ip_compression pVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  byte bVar7;
  uint size;
  byte *pbVar8;
  uint64_t val;
  byte *pos;
  long lVar9;
  long lVar10;
  pt_opcode pStack_50;
  byte local_3f [15];
  
  if (packet == (pt_packet *)0x0 || encoder == (pt_encoder *)0x0) {
    return -2;
  }
  if (0x1a < packet->type - ppt_pad) {
    return -4;
  }
  pbVar8 = encoder->pos;
  switch(packet->type) {
  case ppt_pad:
    iVar4 = pt_reserve(encoder,1);
    if (iVar4 < 0) {
      return iVar4;
    }
    *pbVar8 = 0;
    goto LAB_0010845b;
  case ppt_psb:
    iVar4 = pt_reserve(encoder,0x10);
    if (iVar4 < 0) {
      return iVar4;
    }
    val = 0x8202820282028202;
    size = 8;
    pos = pt_encode_int(pbVar8,0x8202820282028202,8);
    break;
  case ppt_psbend:
    iVar4 = pt_reserve(encoder,2);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0x23;
    goto LAB_00108474;
  case ppt_fup:
    pStack_50 = pt_opc_fup;
    goto LAB_0010824e;
  case ppt_tip:
    pStack_50 = pt_opc_tip;
    goto LAB_0010824e;
  case ppt_tip_pge:
    pStack_50 = pt_opc_tip_pge;
    goto LAB_0010824e;
  case ppt_tip_pgd:
    pStack_50 = pt_opc_tip_pgd;
LAB_0010824e:
    iVar4 = pt_encode_ip(encoder,pStack_50,&(packet->payload).ip);
    return iVar4;
  case ppt_tnt_8:
    bVar3 = (packet->payload).tnt.bit_size;
    if (6 < bVar3) {
      return -5;
    }
    iVar4 = pt_reserve(encoder,1);
    if (iVar4 < 0) {
      return iVar4;
    }
    *pbVar8 = (char)*(undefined4 *)((long)&packet->payload + 8) * '\x02' |
              (byte)(1 << ((byte)(bVar3 + 1) & 0x1f));
LAB_0010845b:
    lVar10 = 1;
    pbVar8 = pbVar8 + 1;
    goto LAB_00108478;
  case ppt_tnt_64:
    iVar4 = pt_reserve(encoder,8);
    if (iVar4 < 0) {
      return iVar4;
    }
    bVar3 = (packet->payload).tnt.bit_size;
    if (0x2f < (ulong)bVar3) {
      return -2;
    }
    uVar5 = (packet->payload).tnt.payload;
    if (uVar5 >> (bVar3 & 0x3f) != 0) {
      return -2;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0xa3;
    val = uVar5 | 1L << ((ulong)bVar3 & 0x3f);
    goto LAB_001082c3;
  case ppt_mode:
    iVar4 = pt_reserve(encoder,2);
    if (iVar4 < 0) {
      return iVar4;
    }
    pVar2 = (packet->payload).ip.ipc;
    if (pVar2 == 0x20) {
      bVar3 = (packet->payload).cfe.vector & 3 | 0x20;
    }
    else {
      if (pVar2 != pt_ipc_suppressed) {
        return -5;
      }
      bVar3 = (packet->payload).cfe.vector & 7;
    }
    *pbVar8 = 0x99;
    goto LAB_00108471;
  case ppt_pip:
    iVar4 = pt_reserve(encoder,8);
    if (iVar4 < 0) {
      return iVar4;
    }
    uVar5 = (packet->payload).pip.cr3 >> 4;
    val = uVar5 | 1;
    if (((packet->payload).ptw.plc & 1) == 0) {
      val = uVar5 & 0xfffffffffffffffe;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0x43;
LAB_001082c3:
    pos = pbVar8 + 2;
    size = 6;
    break;
  case ppt_vmcs:
    iVar4 = pt_reserve(encoder,7);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 200;
    val = (packet->payload).pip.cr3 >> 0xc;
    goto LAB_001083cc;
  case ppt_cbr:
    iVar4 = pt_reserve(encoder,4);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 3;
    pbVar8[2] = (packet->payload).tnt.bit_size;
    pbVar8[3] = 0;
    goto LAB_001080be;
  case ppt_tsc:
    iVar4 = pt_reserve(encoder,8);
    if (iVar4 < 0) {
      return iVar4;
    }
    pos = pbVar8 + 1;
    *pbVar8 = 0x19;
    val = (packet->payload).pip.cr3;
    size = 7;
    break;
  case ppt_tma:
    iVar4 = pt_reserve(encoder,7);
    if (iVar4 < 0) {
      return iVar4;
    }
    val = (uint64_t)(packet->payload).tma.fc;
    if (0x1ff < val) {
      return -5;
    }
    uVar1 = (packet->payload).tma.ctc;
    pbVar8[0] = 2;
    pbVar8[1] = 0x73;
    size = 2;
    puVar6 = pt_encode_int(pbVar8 + 2,(ulong)uVar1,2);
    *puVar6 = '\0';
    pos = puVar6 + 1;
    break;
  case ppt_mtc:
    iVar4 = pt_reserve(encoder,2);
    if (iVar4 < 0) {
      return iVar4;
    }
    *pbVar8 = 0x59;
    bVar3 = (packet->payload).tnt.bit_size;
LAB_00108471:
    pbVar8[1] = bVar3;
    goto LAB_00108474;
  case ppt_cyc:
    uVar5 = (packet->payload).pip.cr3;
    local_3f[0] = (0x1f < uVar5) << 2 | (char)uVar5 * '\b' | 3;
    lVar9 = 1;
    for (uVar5 = uVar5 >> 5; uVar5 != 0; uVar5 = uVar5 >> 7) {
      if (lVar9 == 0xf) {
        return -5;
      }
      local_3f[lVar9] = 0x7f < uVar5 | (char)uVar5 * '\x02';
      lVar9 = lVar9 + 1;
    }
    iVar4 = pt_reserve(encoder,(uint)lVar9);
    if (iVar4 < 0) {
      return iVar4;
    }
    for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
      pbVar8[lVar10] = local_3f[lVar10];
    }
    pbVar8 = pbVar8 + lVar10;
    goto LAB_00108478;
  case ppt_stop:
    iVar4 = pt_reserve(encoder,2);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0x83;
    goto LAB_00108474;
  case ppt_ovf:
    iVar4 = pt_reserve(encoder,2);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0xf3;
    goto LAB_00108474;
  case ppt_mnt:
    iVar4 = pt_reserve(encoder,0xb);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0xc3;
    pbVar8[2] = 0x88;
    val = (packet->payload).pip.cr3;
    goto LAB_001083fb;
  case ppt_exstop:
    iVar4 = pt_reserve(encoder,2);
    if (iVar4 < 0) {
      return iVar4;
    }
    bVar3 = 0xe2;
    if (((packet->payload).tnt.bit_size & 1) == 0) {
      bVar3 = 0x62;
    }
    *pbVar8 = 2;
    pbVar8[1] = bVar3;
LAB_00108474:
    lVar10 = 2;
    pbVar8 = pbVar8 + 2;
LAB_00108478:
    encoder->pos = pbVar8;
    return (int)lVar10;
  case ppt_mwait:
    iVar4 = pt_reserve(encoder,10);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0xc2;
    size = 4;
    pos = pt_encode_int(pbVar8 + 2,(ulong)(packet->payload).ip.ipc,4);
    val = (uint64_t)(packet->payload).mwait.ext;
    break;
  case ppt_pwre:
    iVar4 = pt_reserve(encoder,4);
    if (iVar4 < 0) {
      return iVar4;
    }
    val = (uint64_t)
          ((((packet->payload).pwre.sub_state & 0xf) << 8 | ((packet->payload).ip.ipc & 0xf) << 0xc)
          + (*(byte *)((long)&packet->payload + 2) & 1) * 8);
    pbVar8[0] = 2;
    pbVar8[1] = 0x22;
    pos = pbVar8 + 2;
    size = 2;
    break;
  case ppt_pwrx:
    iVar4 = pt_reserve(encoder,7);
    if (iVar4 < 0) {
      return iVar4;
    }
    bVar3 = *(byte *)((long)&packet->payload + 2);
    val = (uint64_t)
          ((bVar3 & 6) << 9 |
          (bVar3 & 1) << 8 |
          (packet->payload).pwre.sub_state & 0xf | ((packet->payload).ip.ipc & 0xf) << 4);
    pbVar8[0] = 2;
    pbVar8[1] = 0xa2;
LAB_001083cc:
    pos = pbVar8 + 2;
    size = 5;
    break;
  case ppt_ptw:
    bVar3 = (packet->payload).ptw.plc;
    if (bVar3 - 2 < 2) {
      return -5;
    }
    if (bVar3 == 0) {
      size = 4;
    }
    else {
      if (bVar3 != 1) {
        return -1;
      }
      size = 8;
    }
    iVar4 = pt_reserve(encoder,size | 2);
    if (iVar4 < 0) {
      return iVar4;
    }
    bVar7 = 0x92;
    if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x100) ==
        (undefined1  [16])0x0) {
      bVar7 = 0x12;
    }
    *pbVar8 = 2;
    pos = pbVar8 + 2;
    pbVar8[1] = bVar7 | bVar3 << 5;
    val = (packet->payload).pip.cr3;
    break;
  case ppt_cfe:
    iVar4 = pt_reserve(encoder,4);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0x13;
    pbVar8[2] = *(char *)((long)&packet->payload + 5) << 7 | (packet->payload).tnt.bit_size & 0x1f;
    pbVar8[3] = (packet->payload).cfe.vector;
LAB_001080be:
    lVar10 = 4;
    pbVar8 = pbVar8 + 4;
    goto LAB_00108478;
  case ppt_evd:
    iVar4 = pt_reserve(encoder,0xb);
    if (iVar4 < 0) {
      return iVar4;
    }
    pbVar8[0] = 2;
    pbVar8[1] = 0x53;
    pbVar8[2] = (packet->payload).tnt.bit_size & 0x1f;
    val = (packet->payload).tnt.payload;
LAB_001083fb:
    pos = pbVar8 + 3;
    size = 8;
  }
  puVar6 = pt_encode_int(pos,val,size);
  encoder->pos = puVar6;
  return (int)puVar6 - (int)pbVar8;
}

Assistant:

int pt_enc_next(struct pt_encoder *encoder, const struct pt_packet *packet)
{
	uint8_t *pos, *begin;
	int errcode;

	if (!encoder || !packet)
		return -pte_invalid;

	pos = begin = encoder->pos;
	switch (packet->type) {
	case ppt_pad:
		errcode = pt_reserve(encoder, ptps_pad);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_pad;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_psb: {
		uint64_t psb;

		errcode = pt_reserve(encoder, ptps_psb);
		if (errcode < 0)
			return errcode;

		psb = ((uint64_t) pt_psb_hilo << 48 |
		       (uint64_t) pt_psb_hilo << 32 |
		       (uint64_t) pt_psb_hilo << 16 |
		       (uint64_t) pt_psb_hilo);

		pos = pt_encode_int(pos, psb, 8);
		pos = pt_encode_int(pos, psb, 8);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_psbend:
		errcode = pt_reserve(encoder, ptps_psbend);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_psbend;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_ovf:
		errcode = pt_reserve(encoder, ptps_ovf);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ovf;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_fup:
		return pt_encode_ip(encoder, pt_opc_fup, &packet->payload.ip);

	case ppt_tip:
		return pt_encode_ip(encoder, pt_opc_tip, &packet->payload.ip);

	case ppt_tip_pge:
		return pt_encode_ip(encoder, pt_opc_tip_pge,
				    &packet->payload.ip);

	case ppt_tip_pgd:
		return pt_encode_ip(encoder, pt_opc_tip_pgd,
				    &packet->payload.ip);

	case ppt_tnt_8: {
		uint8_t opc, stop;

		if (packet->payload.tnt.bit_size >= 7)
			return -pte_bad_packet;

		errcode = pt_reserve(encoder, ptps_tnt_8);
		if (errcode < 0)
			return errcode;

		stop = packet->payload.tnt.bit_size + pt_opm_tnt_8_shr;
		opc = (uint8_t)
			(packet->payload.tnt.payload << pt_opm_tnt_8_shr);

		*pos++ = (uint8_t) (opc | (1u << stop));

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tnt_64: {
		uint64_t tnt, stop;

		errcode = pt_reserve(encoder, ptps_tnt_64);
		if (errcode < 0)
			return errcode;

		if (packet->payload.tnt.bit_size >= pt_pl_tnt_64_bits)
			return -pte_invalid;

		stop = 1ull << packet->payload.tnt.bit_size;
		tnt = packet->payload.tnt.payload;

		if (tnt & ~(stop - 1))
			return -pte_invalid;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tnt_64;
		pos = pt_encode_int(pos, tnt | stop, pt_pl_tnt_64_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mode: {
		uint8_t mode;

		errcode = pt_reserve(encoder, ptps_mode);
		if (errcode < 0)
			return errcode;

		switch (packet->payload.mode.leaf) {
		default:
			return -pte_bad_packet;

		case pt_mol_exec:
			mode = pt_mol_exec;

			if (packet->payload.mode.bits.exec.csl)
				mode |= pt_mob_exec_csl;

			if (packet->payload.mode.bits.exec.csd)
				mode |= pt_mob_exec_csd;

			if (packet->payload.mode.bits.exec.iflag)
				mode |= pt_mob_exec_iflag;
			break;

		case pt_mol_tsx:
			mode = pt_mol_tsx;

			if (packet->payload.mode.bits.tsx.intx)
				mode |= pt_mob_tsx_intx;

			if (packet->payload.mode.bits.tsx.abrt)
				mode |= pt_mob_tsx_abrt;
			break;
		}

		*pos++ = pt_opc_mode;
		*pos++ = mode;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pip: {
		uint64_t cr3;

		errcode = pt_reserve(encoder, ptps_pip);
		if (errcode < 0)
			return errcode;

		cr3 = packet->payload.pip.cr3;
		cr3 >>= pt_pl_pip_shl;
		cr3 <<= pt_pl_pip_shr;

		if (packet->payload.pip.nr)
			cr3 |= (uint64_t) pt_pl_pip_nr;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pip;
		pos = pt_encode_int(pos, cr3, pt_pl_pip_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tsc:
		errcode = pt_reserve(encoder, ptps_tsc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_tsc;
		pos = pt_encode_int(pos, packet->payload.tsc.tsc,
				    pt_pl_tsc_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cbr:
		errcode = pt_reserve(encoder, ptps_cbr);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cbr;
		*pos++ = packet->payload.cbr.ratio;
		*pos++ = 0;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_tma: {
		uint16_t ctc, fc;

		errcode = pt_reserve(encoder, ptps_tma);
		if (errcode < 0)
			return errcode;

		ctc = packet->payload.tma.ctc;
		fc = packet->payload.tma.fc;

		if (fc & ~pt_pl_tma_fc_mask)
			return -pte_bad_packet;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tma;
		pos = pt_encode_int(pos, ctc, pt_pl_tma_ctc_size);
		*pos++ = 0;
		pos = pt_encode_int(pos, fc, pt_pl_tma_fc_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mtc:
		errcode = pt_reserve(encoder, ptps_mtc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_mtc;
		*pos++ = packet->payload.mtc.ctc;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cyc: {
		uint8_t byte[pt_pl_cyc_max_size], index, end;
		uint64_t ctc;

		ctc = (uint8_t) packet->payload.cyc.value;
		ctc <<= pt_opm_cyc_shr;

		byte[0] = pt_opc_cyc;
		byte[0] |= (uint8_t) ctc;

		ctc = packet->payload.cyc.value;
		ctc >>= (8 - pt_opm_cyc_shr);
		if (ctc)
			byte[0] |= pt_opm_cyc_ext;

		for (end = 1; ctc; ++end) {
			/* Check if the CYC payload is too big. */
			if (pt_pl_cyc_max_size <= end)
				return -pte_bad_packet;

			ctc <<= pt_opm_cycx_shr;

			byte[end] = (uint8_t) ctc;

			ctc >>= 8;
			if (ctc)
				byte[end] |= pt_opm_cycx_ext;
		}

		errcode = pt_reserve(encoder, end);
		if (errcode < 0)
			return errcode;

		for (index = 0; index < end; ++index)
			*pos++ = byte[index];

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_stop:
		errcode = pt_reserve(encoder, ptps_stop);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_stop;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_vmcs:
		errcode = pt_reserve(encoder, ptps_vmcs);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_vmcs;
		pos = pt_encode_int(pos,
				    packet->payload.vmcs.base >> pt_pl_vmcs_shl,
				    pt_pl_vmcs_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_mnt:
		errcode = pt_reserve(encoder, ptps_mnt);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ext2;
		*pos++ = pt_ext2_mnt;
		pos = pt_encode_int(pos, packet->payload.mnt.payload,
				    pt_pl_mnt_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_exstop: {
		uint8_t ext;

		errcode = pt_reserve(encoder, ptps_exstop);
		if (errcode < 0)
			return errcode;

		ext = packet->payload.exstop.ip ?
			pt_ext_exstop_ip : pt_ext_exstop;

		*pos++ = pt_opc_ext;
		*pos++ = ext;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mwait:
		errcode = pt_reserve(encoder, ptps_mwait);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_mwait;
		pos = pt_encode_int(pos, packet->payload.mwait.hints,
				    pt_pl_mwait_hints_size);
		pos = pt_encode_int(pos, packet->payload.mwait.ext,
				    pt_pl_mwait_ext_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_pwre: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwre);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwre.state <<
			    pt_pl_pwre_state_shr) &
			(uint64_t) pt_pl_pwre_state_mask;
		payload |= ((uint64_t) packet->payload.pwre.sub_state <<
			    pt_pl_pwre_sub_state_shr) &
			(uint64_t) pt_pl_pwre_sub_state_mask;

		if (packet->payload.pwre.hw)
			payload |= (uint64_t) pt_pl_pwre_hw_mask;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwre;
		pos = pt_encode_int(pos, payload, pt_pl_pwre_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pwrx: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwrx);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwrx.last <<
			    pt_pl_pwrx_last_shr) &
			(uint64_t) pt_pl_pwrx_last_mask;
		payload |= ((uint64_t) packet->payload.pwrx.deepest <<
			    pt_pl_pwrx_deepest_shr) &
			(uint64_t) pt_pl_pwrx_deepest_mask;

		if (packet->payload.pwrx.interrupt)
			payload |= (uint64_t) pt_pl_pwrx_wr_int;
		if (packet->payload.pwrx.store)
			payload |= (uint64_t) pt_pl_pwrx_wr_store;
		if (packet->payload.pwrx.autonomous)
			payload |= (uint64_t) pt_pl_pwrx_wr_hw;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwrx;
		pos = pt_encode_int(pos, payload, pt_pl_pwrx_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_ptw: {
		uint8_t plc, ext;
		int size;

		plc = packet->payload.ptw.plc;

		size = pt_ptw_size(plc);
		if (size < 0)
			return size;

		errcode = pt_reserve(encoder,
				     (unsigned int) (pt_opcs_ptw + size));
		if (errcode < 0)
			return errcode;

		ext = pt_ext_ptw;
		ext |= plc << pt_opm_ptw_pb_shr;

		if (packet->payload.ptw.ip)
			ext |= (uint8_t) pt_opm_ptw_ip;

		*pos++ = pt_opc_ext;
		*pos++ = ext;
		pos = pt_encode_int(pos, packet->payload.ptw.payload, size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_cfe: {
		uint8_t type;

		errcode = pt_reserve(encoder, ptps_cfe);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cfe;

		type = packet->payload.cfe.type & pt_pl_cfe_type;
		if (packet->payload.cfe.ip)
			type |= pt_pl_cfe_ip;

		*pos++ = type;
		*pos++ = packet->payload.cfe.vector;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_evd:
		errcode = pt_reserve(encoder, ptps_evd);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_evd;

		*pos++ = packet->payload.evd.type & pt_pl_evd_type;
		pos = pt_encode_int(pos, packet->payload.evd.payload,
				    pt_pl_evd_pl_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_unknown:
	case ppt_invalid:
		return -pte_bad_opc;
	}

	return -pte_bad_opc;
}